

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSO.h
# Opt level: O3

void __thiscall PSO::printResult(PSO *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"PSO Predicted Point : ",0x16);
  poVar1 = std::ostream::_M_insert<double>
                     (*(this->result).first.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," , ",3);
  poVar1 = std::ostream::_M_insert<double>
                     ((this->result).first.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[1]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error : ",8);
  poVar1 = std::ostream::_M_insert<double>((this->result).second);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

auto printResult() -> void
    {
        cout << "PSO Predicted Point : " << result.first[0] << " , " << result.first[1] << endl;
        cout << "Error : " << result.second << endl;
    }